

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QVariant * __thiscall
QWidget::inputMethodQuery(QVariant *__return_storage_ptr__,QWidget *this,InputMethodQuery query)

{
  QWidgetData *pQVar1;
  InputMethodHints IVar2;
  ulong uVar3;
  ulong uVar4;
  QRect QVar5;
  
  if (query == ImInputItemClipRectangle) {
    QVar5 = QWidgetPrivate::clipRect(*(QWidgetPrivate **)&this->field_0x8);
  }
  else {
    if (query == ImFont) {
      QFont::operator_cast_to_QVariant(__return_storage_ptr__,&this->data->fnt);
      return __return_storage_ptr__;
    }
    if (query == ImAnchorPosition) {
      (**(code **)(*(long *)this + 400))(__return_storage_ptr__,this,8);
      return __return_storage_ptr__;
    }
    if (query == ImHints) {
      IVar2 = inputMethodHints(this);
      ::QVariant::QVariant
                (__return_storage_ptr__,
                 (int)IVar2.super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.
                      super_QFlagsStorage<Qt::InputMethodHint>.i);
      return __return_storage_ptr__;
    }
    if (query != ImCursorRectangle) {
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
      (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
      return __return_storage_ptr__;
    }
    pQVar1 = this->data;
    uVar3 = (long)(((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1) / 2 & 0xffffffff;
    uVar4 = (ulong)(uint)((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) << 0x20 | uVar3;
    QVar5.x2.m_i = (int)uVar4;
    QVar5.y2.m_i = (int)(uVar4 >> 0x20);
    QVar5.x1.m_i = (int)uVar3;
    QVar5.y1.m_i = (int)(uVar3 >> 0x20);
  }
  ::QVariant::QVariant(__return_storage_ptr__,QVar5);
  return __return_storage_ptr__;
}

Assistant:

QVariant QWidget::inputMethodQuery(Qt::InputMethodQuery query) const
{
    switch(query) {
    case Qt::ImCursorRectangle:
        return QRect(width()/2, 0, 1, height());
    case Qt::ImFont:
        return font();
    case Qt::ImAnchorPosition:
        // Fallback.
        return inputMethodQuery(Qt::ImCursorPosition);
    case Qt::ImHints:
        return (int)inputMethodHints();
    case Qt::ImInputItemClipRectangle:
        return d_func()->clipRect();
    default:
        return QVariant();
    }
}